

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O3

void __thiscall imrt::Collimator::Collimator(Collimator *this,Collimator *c)

{
  _Rb_tree_header *p_Var1;
  list<int,_std::allocator<int>_> *plVar2;
  int iVar3;
  
  p_Var1 = &(this->beam_coord)._M_t._M_impl.super__Rb_tree_header;
  (this->beam_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->beam_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->beam_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->beam_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->beam_coord)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->angle_coord)._M_t._M_impl.super__Rb_tree_header;
  (this->angle_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->angle_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->angle_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->angle_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->angle_row_beam_active)._M_t._M_impl.super__Rb_tree_header;
  (this->angle_row_beam_active)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->angle_row_beam_active)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->angle_coord)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->ycoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->ycoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->ycoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->angle_row_beam_active)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->angle_row_beam_active)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->angle_row_beam_active)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->nb_angle_beamlets)._M_t._M_impl.super__Rb_tree_header;
  (this->nb_angle_beamlets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->nb_angle_beamlets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->nb_angle_beamlets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->nb_angle_beamlets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->nb_angle_beamlets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  plVar2 = &this->angles;
  (this->angles).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)plVar2;
  (this->angles).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)plVar2;
  (this->angles).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
  (this->coord_files).
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->coord_files).
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->coord_files).
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->reference)._M_t._M_impl.super__Rb_tree_header;
  (this->reference)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->reference)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->reference)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->reference)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->intensity_to_levels)._M_t._M_impl.super__Rb_tree_header;
  (this->intensity_to_levels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->intensity_to_levels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->reference)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->levels_to_intensity).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->levels_to_intensity).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->levels_to_intensity).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->intensity_to_levels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->intensity_to_levels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->intensity_to_levels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::
  _Rb_tree<double,_std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::operator=((_Rb_tree<double,_std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
               *)this,(_Rb_tree<double,_std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                       *)c);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
  ::operator=(&(this->angle_coord)._M_t,&(c->angle_coord)._M_t);
  std::vector<double,_std::allocator<double>_>::operator=(&this->xcoord,&c->xcoord);
  std::vector<double,_std::allocator<double>_>::operator=(&this->ycoord,&c->ycoord);
  iVar3 = c->xdim;
  this->nb_beamlets = c->nb_beamlets;
  this->xdim = iVar3;
  this->ydim = c->ydim;
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  ::operator=(&(this->angle_row_beam_active)._M_t,&(c->angle_row_beam_active)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::operator=(&(this->nb_angle_beamlets)._M_t,&(c->nb_angle_beamlets)._M_t);
  if (this != c) {
    std::__cxx11::list<int,std::allocator<int>>::_M_assign_dispatch<std::_List_const_iterator<int>>
              ((list<int,std::allocator<int>> *)plVar2,
               (c->angles).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
               super__List_node_base._M_next,&c->angles);
  }
  this->n_angles = c->n_angles;
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&this->coord_files,&c->coord_files);
  return;
}

Assistant:

Collimator::Collimator(const Collimator& c){
    beam_coord=c.beam_coord;
    angle_coord=c.angle_coord;
    xcoord=c.xcoord;
    ycoord=c.ycoord;
    nb_beamlets=c.nb_beamlets;
    xdim=c.xdim;
    ydim=c.ydim;
    angle_row_beam_active=c.angle_row_beam_active;
    nb_angle_beamlets=c.nb_angle_beamlets;
    angles=c.angles;
    n_angles=c.n_angles;
    coord_files=c.coord_files;
  }